

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall
Object_SingleNumber_Test<wchar_t>::~Object_SingleNumber_Test
          (Object_SingleNumber_Test<wchar_t> *this)

{
  anon_unknown.dwarf_faccb::Object<wchar_t>::~Object(&this->super_Object<wchar_t>);
  operator_delete(this,0x188);
  return;
}

Assistant:

TYPED_TEST (Object, SingleNumber) {
    using namespace ::pstore::dump;
    object v{object::container{{"key", make_number (42)}}};
    v.write (this->out);
    auto const & actual = this->out.str ();
    EXPECT_THAT (split_tokens (actual),
                 ::testing::ElementsAre (convert<TypeParam> ("key"), convert<TypeParam> (":"),
                                         convert<TypeParam> ("0x2a")));
}